

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ch.cpp
# Opt level: O2

HRESULT ExecuteTestWithMemoryCheck(char *fileName)

{
  HRESULT HVar1;
  
  HVar1 = ExecuteTest(fileName);
  if (-1 < HVar1) {
    PAL__flushall();
    if ((ChakraRTInterface::m_testHooks.pfSetEnableCheckMemoryLeakOutput !=
         (SetEnableCheckMemoryLeakOutputPtr)0x0 & ChakraRTInterface::m_testHooksSetup) == 1) {
      (*ChakraRTInterface::m_testHooks.pfSetEnableCheckMemoryLeakOutput)(true);
    }
    return HVar1;
  }
  PAL_exit(0);
}

Assistant:

HRESULT ExecuteTestWithMemoryCheck(char* fileName)
{
    HRESULT hr = E_FAIL;
#ifdef _WIN32 // looks on linux it always leak ThreadContextTLSEntry since there's no DllMain
#ifdef CHECK_MEMORY_LEAK
    // Always check memory leak, unless user specified the flag already
    if (!ChakraRTInterface::IsEnabledCheckMemoryFlag())
    {
        ChakraRTInterface::SetCheckMemoryLeakFlag(true);
    }

    // Disable the output in case an unhandled exception happens
    // We will re-enable it if there is no unhandled exceptions
    ChakraRTInterface::SetEnableCheckMemoryLeakOutput(false);
#endif
#endif

#ifdef _WIN32
    __try
    {
        hr = ExecuteTest(fileName);
    }
    __except (HostExceptionFilter(GetExceptionCode(), GetExceptionInformation()))
    {
        Assert(false);
    }
#else
    // REVIEW: Do we need a SEH handler here?
    hr = ExecuteTest(fileName);
    if (FAILED(hr)) exit(0);
#endif // _WIN32

    _flushall();
#ifdef CHECK_MEMORY_LEAK
    ChakraRTInterface::SetEnableCheckMemoryLeakOutput(true);
#endif
    return hr;
}